

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

UChar __thiscall
icu_63::UCharCharacterIterator::setIndex(UCharCharacterIterator *this,int32_t position)

{
  UChar UVar1;
  int iVar2;
  
  iVar2 = (this->super_CharacterIterator).begin;
  if ((position < iVar2) || (iVar2 = (this->super_CharacterIterator).end, iVar2 < position)) {
    (this->super_CharacterIterator).pos = iVar2;
  }
  else {
    (this->super_CharacterIterator).pos = position;
  }
  iVar2 = (this->super_CharacterIterator).pos;
  UVar1 = L'\xffff';
  if (iVar2 < (this->super_CharacterIterator).end) {
    UVar1 = this->text[iVar2];
  }
  return UVar1;
}

Assistant:

UChar
UCharCharacterIterator::setIndex(int32_t position) {
    if(position < begin) {
        pos = begin;
    } else if(position > end) {
        pos = end;
    } else {
        pos = position;
    }
    if(pos < end) {
        return text[pos];
    } else {
        return DONE;
    }
}